

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O3

_Bool borg_flow_vault(wchar_t nearness)

{
  int iVar1;
  chunk_conflict *c;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  loc_conflict grid2;
  loc grid;
  term *ptVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  borg_temp_n = 0;
  if ((vault_on_level) && (_Var2 = borg_can_dig(false,'\x12'), _Var2)) {
    _Var2 = borg_can_dig(false,'\x15');
    ptVar5 = Term;
    wVar4 = w_y;
    for (lVar6 = (long)w_y; iVar1 = ptVar5->sidebar_mode,
        lVar6 < (ptVar5->hgt - (row_top_map[iVar1] + row_bottom_map[iVar1])) /
                (int)(uint)tile_height + wVar4; lVar6 = lVar6 + 1) {
      if (0 < (~col_map[iVar1] + ptVar5->wid) / (int)(uint)tile_width) {
        lVar10 = (long)w_x;
        do {
          grid2 = loc((int)lVar10,(int)lVar6);
          wVar4 = distance(borg.c,grid2);
          if ((wVar4 <= nearness) &&
             (((byte)(borg_grids[lVar6][lVar10].feat - 0x10) < 5 ||
              (borg_grids[lVar6][lVar10].feat == '\x15' && _Var2)))) {
            lVar9 = 0;
            do {
              c = cave;
              lVar7 = (long)ddx_ddd[lVar9] + (long)(int)lVar10;
              lVar8 = (long)ddy_ddd[lVar9] + (long)(int)lVar6;
              grid = (loc)loc((int)lVar7,(int)lVar8);
              _Var3 = square_in_bounds_fully(c,grid);
              if ((_Var3) && (borg_grids[lVar8][lVar7].feat == '\x16')) {
                borg_temp_y[borg_temp_n] = (uint8_t)lVar6;
                borg_temp_x[borg_temp_n] = (uint8_t)lVar10;
                borg_temp_n = borg_temp_n + 1;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 8);
          }
          lVar10 = lVar10 + 1;
          ptVar5 = Term;
          wVar4 = w_y;
        } while (lVar10 < (long)((~col_map[Term->sidebar_mode] + Term->wid) / (int)(uint)tile_width)
                          + (long)w_x);
      }
    }
    if (borg_temp_n != 0) {
      if (0 < borg_temp_n) {
        lVar6 = 0;
        do {
          borg_flow_enqueue_grid((uint)borg_temp_y[lVar6],(uint)borg_temp_x[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < borg_temp_n);
      }
      borg_flow_spread(L'ú',true,false,false,L'\xffffffff',false);
      _Var2 = borg_flow_commit("vault excavation",L'\b');
      if (_Var2) {
        _Var2 = borg_flow_old(L'\b');
        return _Var2;
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_vault(int nearness)
{
    int  y, x, i;
    int  b_y, b_x;
    bool can_dig_hard;

    borg_grid *ag;

    /* reset counters */
    borg_temp_n = 0;
    i           = 0;

    /* no need if no vault on level */
    if (!vault_on_level)
        return false;

    /* no need if we can't dig at least quartz */
    if (!borg_can_dig(false, FEAT_QUARTZ))
        return false;

    can_dig_hard = borg_can_dig(false, FEAT_GRANITE);

    /* build the array -- Scan screen */
    for (y = w_y; y < w_y + SCREEN_HGT; y++) {
        for (x = w_x; x < w_x + SCREEN_WID; x++) {

            /* only bother with near ones */
            if (distance(borg.c, loc(x, y)) > nearness)
                continue;

            uint8_t feat = borg_grids[y][x].feat;

            /* only deal with excavatable walls */
            if (feat != FEAT_RUBBLE
                && feat != FEAT_QUARTZ 
                && feat != FEAT_MAGMA
                && feat != FEAT_QUARTZ_K 
                && feat != FEAT_MAGMA_K) {
                /* only deal with granite if we are good diggers */
                if (!can_dig_hard || feat != FEAT_GRANITE)
                    continue;
            }

            /* Examine grids adjacent to this grid to see if there is a perma
             * wall adjacent */
            for (i = 0; i < 8; i++) {
                b_x = x + ddx_ddd[i];
                b_y = y + ddy_ddd[i];

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(b_x, b_y)))
                    continue;

                /* Access the grid */
                ag = &borg_grids[b_y][b_x];

                /* Not a perma, and not our spot. */
                if (ag->feat != FEAT_PERM)
                    continue;

                /* keep count */
                borg_temp_y[borg_temp_n] = y;
                borg_temp_x[borg_temp_n] = x;
                borg_temp_n++;
            }
        }
    }

    /* None to flow to */
    if (!borg_temp_n)
        return false;

    /* Examine each ones */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    borg_flow_spread(250, true, false, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("vault excavation", GOAL_VAULT))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_VAULT))
        return false;

    /* Success */
    return true;
}